

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::AddressTest_AddressFromSockaddr_Ipv6SocketAddress_Test::
~AddressTest_AddressFromSockaddr_Ipv6SocketAddress_Test
          (AddressTest_AddressFromSockaddr_Ipv6SocketAddress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AddressTest, AddressFromSockaddr_Ipv6SocketAddress)
{
    Address      addr;
    sockaddr_in6 sockaddr;
    memset(&sockaddr, 0, sizeof(sockaddr));
    sockaddr.sin6_family = AF_INET6;
    sockaddr.sin6_addr   = in6addr_loopback;
    sockaddr.sin6_port   = htons(5684);

    EXPECT_EQ(addr.Set(*reinterpret_cast<sockaddr_storage *>(&sockaddr)), ErrorCode::kNone);
    EXPECT_TRUE(addr.IsValid());
    EXPECT_TRUE(addr.IsIpv6());

    EXPECT_EQ(addr.ToString(), "::1");
}